

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O3

MPP_RET hal_vp8e_vepu2_start_v2(void *hal,HalEncTask *task)

{
  long lVar1;
  MPP_RET MVar2;
  char *fmt;
  ulong uVar3;
  uint uVar4;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  undefined8 local_50;
  int local_48;
  undefined4 local_44;
  undefined8 local_40;
  int local_38;
  undefined4 local_34;
  
  if (((byte)vp8e_hal_debug & 4) == 0) {
    uVar4 = *(uint *)((long)hal + 0x68);
  }
  else if (*(int *)((long)hal + 0x68) == 0) {
    uVar4 = 0;
  }
  else {
    lVar1 = *(long *)((long)hal + 0x58);
    uVar3 = 0;
    do {
      _mpp_log_l(4,"hal_vp8e_vepu2_v2","reg[%d]:%x\n",(char *)0x0,uVar3 & 0xffffffff,
                 (ulong)*(uint *)(lVar1 + uVar3 * 4));
      uVar3 = uVar3 + 1;
      uVar4 = *(uint *)((long)hal + 0x68);
    } while (uVar3 < uVar4);
  }
  local_40 = *(undefined8 *)((long)hal + 0x58);
  local_34 = 0;
  local_38 = uVar4 << 2;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),4,&local_40);
  if (MVar2 == MPP_OK) {
    local_50 = *(undefined8 *)((long)hal + 0x58);
    local_44 = 0;
    local_48 = uVar4 << 2;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),5,&local_50);
    if (MVar2 == MPP_OK) {
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),0xf,(void *)0x0);
      if (MVar2 == MPP_OK) {
        return MPP_OK;
      }
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","send cmd failed %d\n","hal_vp8e_vepu2_start_v2",
                 (ulong)(uint)MVar2);
      return MVar2;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_vp8e_vepu2_v2",fmt,"hal_vp8e_vepu2_start_v2",(ulong)(uint)MVar2);
  return MVar2;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_start_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    if (VP8E_DBG_HAL_DUMP_REG & vp8e_hal_debug) {
        RK_U32 i = 0;
        RK_U32 *tmp = (RK_U32 *)ctx->regs;

        for (; i < ctx->reg_size; i++)
            mpp_log("reg[%d]:%x\n", i, tmp[i]);
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size * sizeof(RK_U32);

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}